

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_Pow(FParser *this)

{
  bool bVar1;
  double dVar2;
  double __y;
  FParser *this_local;
  
  bVar1 = CheckArgs(this,2);
  if (bVar1) {
    dVar2 = floatvalue(this->t_argv);
    __y = floatvalue(this->t_argv + 1);
    dVar2 = pow(dVar2,__y);
    svalue_t::setDouble(&this->t_return,dVar2);
  }
  return;
}

Assistant:

void FParser::SF_Pow()
{
	if (CheckArgs(2))
	{
		t_return.setDouble(pow(floatvalue(t_argv[0]), floatvalue(t_argv[1])));
	}
}